

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_AllTests_Test::TestBody(TCMallocTest_AllTests_Test *this)

{
  undefined1 auVar1 [8];
  pointer piVar2;
  char cVar3;
  undefined4 uVar4;
  long lVar5;
  int *piVar6;
  TestingPortal *pTVar7;
  void *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  *this_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var8;
  char *pcVar9;
  int s;
  size_t size;
  pair<int_*,_long> pVar10;
  AllocatorState local_a8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  size_t actual_p1_size;
  void *p2;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  void *p1;
  overaligned_type *poveraligned;
  undefined1 auStack_48 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_a8.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super_TestHarness.total_weight_ = 0;
  local_a8.super_TestHarness.num_tests_ = 0;
  local_a8.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super_TestHarness.types_.
  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  srandom(100);
  local_a8._vptr_AllocatorState = (_func_int **)&PTR__AllocatorState_00162d40;
  lVar5 = random();
  local_a8.memalign_fraction_ =
       ((double)((int)lVar5 +
                ((int)(SUB168(SEXT816(lVar5) * SEXT816(0x346dc5d63886594b),8) >> 0xb) -
                (SUB164(SEXT816(lVar5) * SEXT816(0x346dc5d63886594b),0xc) >> 0x1f)) * -10000) /
       10000.0) * 0.4 + 0.0;
  puts("Testing empty allocation");
  local_60._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       AllocatorState::alloc(&local_a8,0);
  actual_p1_size = 0;
  testing::internal::CmpHelperNE<void*,decltype(nullptr)>
            ((internal *)auStack_48,"p1","nullptr",&local_60._M_head_impl,(void **)&actual_p1_size);
  if (auStack_48[0] == (internal)0x0) {
    testing::Message::Message((Message *)&actual_p1_size);
    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
        (pointer)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x520,pcVar9);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&actual_p1_size)
    ;
LAB_001110f8:
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_78);
    _Var8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)actual_p1_size;
  }
  else {
    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
        (pointer)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start);
    }
    actual_p1_size = (size_t)AllocatorState::alloc(&local_a8,0);
    local_78._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::CmpHelperNE<void*,decltype(nullptr)>
              ((internal *)auStack_48,"p2","nullptr",(void **)&actual_p1_size,&local_78._M_head_impl
              );
    if (auStack_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_78);
      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&p1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x522,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_78);
    }
    else {
      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          != (pointer)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start);
      }
      testing::internal::CmpHelperNE<void*,void*>
                ((internal *)auStack_48,"p1","p2",&local_60._M_head_impl,(void **)&actual_p1_size);
      if (auStack_48[0] != (internal)0x0) {
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
        }
        free(local_60._M_head_impl);
        free((void *)actual_p1_size);
        puts("Testing STL use");
        auStack_48 = (undefined1  [8])0x0;
        v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        local_60._M_head_impl._0_4_ = 1;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)auStack_48,(iterator)0x0,(int *)&local_60);
        local_60._M_head_impl._0_4_ = 2;
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            == v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,
                     (iterator)
                     v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start,(int *)&local_60);
        }
        else {
          *v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
               = 2;
          v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
        }
        local_60._M_head_impl._0_4_ = 3;
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            == v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,
                     (iterator)
                     v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start,(int *)&local_60);
        }
        else {
          *v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
               = 3;
          v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
        }
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)local_60._M_head_impl._4_4_ << 0x20);
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            == v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)auStack_48,
                     (iterator)
                     v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_start,(int *)&local_60);
        }
        else {
          *v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
               = 0;
          v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start + 1;
        }
        piVar2 = v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        auVar1 = auStack_48;
        if (auStack_48 !=
            (undefined1  [8])
            v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           ) {
          lVar5 = (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start - (long)auStack_48 >> 2;
          pVar10 = std::get_temporary_buffer<int>((lVar5 - (lVar5 + 1 >> 0x3f)) + 1 >> 1);
          lVar5 = pVar10.second;
          piVar6 = pVar10.first;
          if (piVar6 == (int *)0x0) {
            lVar5 = 0;
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (auVar1,piVar2);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (auVar1,piVar2,piVar6,lVar5);
          }
          operator_delete(piVar6,lVar5 << 2);
        }
        if (auStack_48 != (undefined1  [8])0x0) {
          operator_delete((void *)auStack_48,
                          (long)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish - (long)auStack_48);
        }
        puts("Sanity-testing all the memory allocation functions");
        SetNewHook();
        SetDeleteHook();
        auStack_48 = (undefined1  [8])malloc;
        (*noopt_helper)(auStack_48);
        actual_p1_size = (*(code *)auStack_48)(10);
        local_60._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                  ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                   &local_60._M_head_impl);
        if (auStack_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_60);
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start == (pointer)0x0) {
            pcVar9 = "";
          }
          else {
            pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_78,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                     ,0x554,pcVar9);
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_78,(Message *)&local_60)
          ;
          this_00 = &local_78;
LAB_00112865:
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
          _Var8._M_head_impl = local_60._M_head_impl;
        }
        else {
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          local_78._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               tc_malloc_size(actual_p1_size);
          local_60._M_head_impl._0_4_ = 10;
          testing::internal::CmpHelperGE<unsigned_long,int>
                    ((internal *)auStack_48,"actual_p1_size","10",(unsigned_long *)&local_78,
                     (int *)&local_60);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x558,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
LAB_00112861:
            this_00 = (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       *)&p1;
            goto LAB_00112865;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          local_60._M_head_impl._0_4_ = 100000;
          testing::internal::CmpHelperLT<unsigned_long,int>
                    ((internal *)auStack_48,"actual_p1_size","100000",(unsigned_long *)&local_78,
                     (int *)&local_60);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x559,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])malloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(10);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x55e,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          tc_free_sized(actual_p1_size,10);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])tc_memalign;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(1,10);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x566,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          tc_free_aligned_sized(actual_p1_size,1,10);
          VerifyDeleteHookWasCalled();
          actual_p1_size = tc_malloc_skip_new_handler(10);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x56c,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])calloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(10,2);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x572,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          auStack_48 = (undefined1  [8])realloc;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(actual_p1_size,30000);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x578,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          VerifyDeleteHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
               PosixMemalign;
          (*noopt_helper)(&local_60);
          uVar4 = (*(code *)local_60._M_head_impl)(&actual_p1_size,8,0x28);
          p1 = (void *)CONCAT44(p1._4_4_,uVar4);
          local_60._M_head_impl = local_60._M_head_impl & 0xffffffff00000000;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)auStack_48,"noopt(PosixMemalign)(&p1, sizeof(p1), 40)","0",
                     (int *)&p1,(int *)&local_60);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x57f,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x580,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])Memalign;
          (*noopt_helper)(auStack_48);
          actual_p1_size = (*(code *)auStack_48)(0x10,0x32);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x586,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])valloc(0x3c);
          (*noopt_helper)(auStack_48);
          actual_p1_size = (size_t)auStack_48;
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x596,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])pvalloc(0x46);
          (*noopt_helper)(auStack_48);
          actual_p1_size = (size_t)auStack_48;
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          testing::internal::CmpHelperNE<void*,decltype(nullptr)>
                    ((internal *)auStack_48,"p1","nullptr",(void **)&actual_p1_size,
                     &local_60._M_head_impl);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_60);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&p1,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x59c,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_60);
            goto LAB_00112861;
          }
          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_start != (pointer)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start);
          }
          VerifyNewHookWasCalled();
          free((void *)actual_p1_size);
          VerifyDeleteHookWasCalled();
          auStack_48 = (undefined1  [8])operator_new(1);
          (*noopt_helper)(auStack_48);
          local_60._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_48
          ;
          p1 = (void *)0x0;
          testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                    ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
          if (auStack_48[0] == (internal)0x0) {
            testing::Message::Message((Message *)&p1);
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start == (pointer)0x0) {
              pcVar9 = "";
            }
            else {
              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&poveraligned,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                       ,0x5a2,pcVar9);
            testing::internal::AssertHelper::operator=((AssertHelper *)&poveraligned,(Message *)&p1)
            ;
LAB_00112a49:
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&poveraligned);
            _Var8._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)p1;
          }
          else {
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            operator_delete(local_60._M_head_impl,1);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new__(100);
            (*noopt_helper)(auStack_48);
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5a8,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_00112a49;
            }
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            if (local_60._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete__(local_60._M_head_impl);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(1,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5ae,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_00112a49;
            }
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            operator_delete(local_60._M_head_impl,1);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new__(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5b4,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_00112a49;
            }
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            if (local_60._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              operator_delete__(local_60._M_head_impl);
            }
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(100);
            (*noopt_helper)(auStack_48);
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5bb,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_00112a49;
            }
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            operator_delete(local_60._M_head_impl);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(100,(nothrow_t *)&std::nothrow);
            (*noopt_helper)(auStack_48);
            local_60._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_48;
            p1 = (void *)0x0;
            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,&p1);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&p1);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&poveraligned,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5c2,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&poveraligned,(Message *)&p1);
              goto LAB_00112a49;
            }
            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start != (pointer)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            VerifyNewHookWasCalled();
            operator_delete(local_60._M_head_impl,(nothrow_t *)&std::nothrow);
            VerifyDeleteHookWasCalled();
            auStack_48 = (undefined1  [8])operator_new(0x80,0x40);
            (*noopt_helper)(auStack_48);
            p1 = (void *)auStack_48;
            poveraligned = (overaligned_type *)0x0;
            testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                      ((internal *)auStack_48,"poveraligned","nullptr",(overaligned_type **)&p1,
                       &poveraligned);
            if (auStack_48[0] == (internal)0x0) {
              testing::Message::Message((Message *)&poveraligned);
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start == (pointer)0x0) {
                pcVar9 = "";
              }
              else {
                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start;
              }
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&p2,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                         ,0x5d6,pcVar9);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&p2,(Message *)&poveraligned);
            }
            else {
              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start != (pointer)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
              p2._0_4_ = 0;
              testing::internal::CmpHelperEQ<unsigned_long,int>
                        ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)","0",
                         (unsigned_long *)&poveraligned,(int *)&p2);
              if (auStack_48[0] == (internal)0x0) {
                testing::Message::Message((Message *)&poveraligned);
                if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start == (pointer)0x0) {
                  pcVar9 = "";
                }
                else {
                  pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start;
                }
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&p2,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                           ,0x5d7,pcVar9);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&p2,(Message *)&poveraligned);
              }
              else {
                if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start != (pointer)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                VerifyNewHookWasCalled();
                operator_delete(p1,0x80,0x40);
                VerifyDeleteHookWasCalled();
                auStack_48 = (undefined1  [8])operator_new__(0x500,0x40);
                (*noopt_helper)(auStack_48);
                p1 = (void *)auStack_48;
                poveraligned = (overaligned_type *)0x0;
                testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                          ((internal *)auStack_48,"poveraligned","nullptr",(overaligned_type **)&p1,
                           &poveraligned);
                if (auStack_48[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&poveraligned);
                  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start == (pointer)0x0) {
                    pcVar9 = "";
                  }
                  else {
                    pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&p2,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                             ,0x5dd,pcVar9);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&p2,(Message *)&poveraligned);
                }
                else {
                  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    std::
                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start);
                  }
                  poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                  p2._0_4_ = 0;
                  testing::internal::CmpHelperEQ<unsigned_long,int>
                            ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)","0",
                             (unsigned_long *)&poveraligned,(int *)&p2);
                  if (auStack_48[0] == (internal)0x0) {
                    testing::Message::Message((Message *)&poveraligned);
                    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start == (pointer)0x0) {
                      pcVar9 = "";
                    }
                    else {
                      pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&p2,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                               ,0x5de,pcVar9);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&p2,(Message *)&poveraligned);
                  }
                  else {
                    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      std::
                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start);
                    }
                    VerifyNewHookWasCalled();
                    if (p1 != (void *)0x0) {
                      operator_delete__(p1,0x40);
                    }
                    VerifyDeleteHookWasCalled();
                    auStack_48 = (undefined1  [8])operator_new(0x80,0x40,(nothrow_t *)&std::nothrow)
                    ;
                    (*noopt_helper)(auStack_48);
                    p1 = (void *)auStack_48;
                    poveraligned = (overaligned_type *)0x0;
                    testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                              ((internal *)auStack_48,"poveraligned","nullptr",
                               (overaligned_type **)&p1,&poveraligned);
                    if (auStack_48[0] == (internal)0x0) {
                      testing::Message::Message((Message *)&poveraligned);
                      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start == (pointer)0x0) {
                        pcVar9 = "";
                      }
                      else {
                        pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&p2,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                 ,0x5e4,pcVar9);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&p2,(Message *)&poveraligned);
                    }
                    else {
                      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        std::
                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)v.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                      p2._0_4_ = 0;
                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                ((internal *)auStack_48,"(((size_t)poveraligned) % kOveralignment)",
                                 "0",(unsigned_long *)&poveraligned,(int *)&p2);
                      if (auStack_48[0] == (internal)0x0) {
                        testing::Message::Message((Message *)&poveraligned);
                        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start == (pointer)0x0) {
                          pcVar9 = "";
                        }
                        else {
                          pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                             .super__Vector_impl_data._M_start;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&p2,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                   ,0x5e5,pcVar9);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&p2,(Message *)&poveraligned);
                      }
                      else {
                        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          std::
                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start);
                        }
                        VerifyNewHookWasCalled();
                        operator_delete(p1,0x80,0x40);
                        VerifyDeleteHookWasCalled();
                        auStack_48 = (undefined1  [8])
                                     operator_new__(0x500,0x40,(nothrow_t *)&std::nothrow);
                        (*noopt_helper)(auStack_48);
                        p1 = (void *)auStack_48;
                        poveraligned = (overaligned_type *)0x0;
                        testing::internal::CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                  ((internal *)auStack_48,"poveraligned","nullptr",
                                   (overaligned_type **)&p1,&poveraligned);
                        if (auStack_48[0] == (internal)0x0) {
                          testing::Message::Message((Message *)&poveraligned);
                          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start == (pointer)0x0) {
                            pcVar9 = "";
                          }
                          else {
                            pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&p2,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                     ,0x5eb,pcVar9);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&p2,(Message *)&poveraligned);
                        }
                        else {
                          if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start != (pointer)0x0) {
                            std::
                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start);
                          }
                          poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                          p2._0_4_ = 0;
                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                    ((internal *)auStack_48,
                                     "(((size_t)poveraligned) % kOveralignment)","0",
                                     (unsigned_long *)&poveraligned,(int *)&p2);
                          if (auStack_48[0] == (internal)0x0) {
                            testing::Message::Message((Message *)&poveraligned);
                            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start == (pointer)0x0) {
                              pcVar9 = "";
                            }
                            else {
                              pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data._M_start;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&p2,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                       ,0x5ec,pcVar9);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&p2,(Message *)&poveraligned);
                          }
                          else {
                            if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start != (pointer)0x0) {
                              std::
                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                            }
                            VerifyNewHookWasCalled();
                            if (p1 != (void *)0x0) {
                              operator_delete__(p1,0x40);
                            }
                            VerifyDeleteHookWasCalled();
                            auStack_48 = (undefined1  [8])operator_new(100,0x40);
                            (*noopt_helper)(auStack_48);
                            local_60._M_head_impl =
                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)auStack_48;
                            poveraligned = (overaligned_type *)0x0;
                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                      ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,
                                       &poveraligned);
                            if (auStack_48[0] == (internal)0x0) {
                              testing::Message::Message((Message *)&poveraligned);
                              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start == (pointer)0x0) {
                                pcVar9 = "";
                              }
                              else {
                                pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_start;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        ((AssertHelper *)&p2,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                         ,0x5f3,pcVar9);
                              testing::internal::AssertHelper::operator=
                                        ((AssertHelper *)&p2,(Message *)&poveraligned);
                            }
                            else {
                              if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start != (pointer)0x0) {
                                std::
                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                              }
                              poveraligned = (overaligned_type *)
                                             (ulong)((uint)local_60._M_head_impl & 0x3f);
                              p2._0_4_ = 0;
                              testing::internal::CmpHelperEQ<unsigned_long,int>
                                        ((internal *)auStack_48,"(((size_t)p2) % kOveralignment)",
                                         "0",(unsigned_long *)&poveraligned,(int *)&p2);
                              if (auStack_48[0] == (internal)0x0) {
                                testing::Message::Message((Message *)&poveraligned);
                                if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start == (pointer)0x0) {
                                  pcVar9 = "";
                                }
                                else {
                                  pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>
                                                     ._M_impl.super__Vector_impl_data._M_start;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          ((AssertHelper *)&p2,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                           ,0x5f4,pcVar9);
                                testing::internal::AssertHelper::operator=
                                          ((AssertHelper *)&p2,(Message *)&poveraligned);
                              }
                              else {
                                if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start != (pointer)0x0) {
                                  std::
                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                }
                                VerifyNewHookWasCalled();
                                operator_delete(local_60._M_head_impl,0x40);
                                VerifyDeleteHookWasCalled();
                                auStack_48 = (undefined1  [8])
                                             operator_new(100,0x40,(nothrow_t *)&std::nothrow);
                                (*noopt_helper)(auStack_48);
                                local_60._M_head_impl =
                                     (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)auStack_48;
                                poveraligned = (overaligned_type *)0x0;
                                testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                          ((internal *)auStack_48,"p2","nullptr",(char **)&local_60,
                                           &poveraligned);
                                if (auStack_48[0] == (internal)0x0) {
                                  testing::Message::Message((Message *)&poveraligned);
                                  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start == (pointer)0x0) {
                                    pcVar9 = "";
                                  }
                                  else {
                                    pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            ((AssertHelper *)&p2,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                             ,0x5fa,pcVar9);
                                  testing::internal::AssertHelper::operator=
                                            ((AssertHelper *)&p2,(Message *)&poveraligned);
                                }
                                else {
                                  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start != (pointer)0x0) {
                                    std::
                                    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                  }
                                  poveraligned = (overaligned_type *)
                                                 (ulong)((uint)local_60._M_head_impl & 0x3f);
                                  p2._0_4_ = 0;
                                  testing::internal::CmpHelperEQ<unsigned_long,int>
                                            ((internal *)auStack_48,
                                             "(((size_t)p2) % kOveralignment)","0",
                                             (unsigned_long *)&poveraligned,(int *)&p2);
                                  if (auStack_48[0] == (internal)0x0) {
                                    testing::Message::Message((Message *)&poveraligned);
                                    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start == (pointer)0x0) {
                                      pcVar9 = "";
                                    }
                                    else {
                                      pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              ((AssertHelper *)&p2,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                               ,0x5fb,pcVar9);
                                    testing::internal::AssertHelper::operator=
                                              ((AssertHelper *)&p2,(Message *)&poveraligned);
                                  }
                                  else {
                                    if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start != (pointer)0x0) {
                                      std::
                                      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                    }
                                    VerifyNewHookWasCalled();
                                    operator_delete(local_60._M_head_impl,0x40,
                                                    (nothrow_t *)&std::nothrow);
                                    VerifyDeleteHookWasCalled();
                                    auStack_48 = (undefined1  [8])operator_new(0x80,0x40);
                                    (*noopt_helper)(auStack_48);
                                    p1 = (void *)auStack_48;
                                    poveraligned = (overaligned_type *)0x0;
                                    testing::internal::
                                    CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                              ((internal *)auStack_48,"poveraligned","nullptr",
                                               (overaligned_type **)&p1,&poveraligned);
                                    if (auStack_48[0] == (internal)0x0) {
                                      testing::Message::Message((Message *)&poveraligned);
                                      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start == (pointer)0x0) {
                                        pcVar9 = "";
                                      }
                                      else {
                                        pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                      }
                                      testing::internal::AssertHelper::AssertHelper
                                                ((AssertHelper *)&p2,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                 ,0x601,pcVar9);
                                      testing::internal::AssertHelper::operator=
                                                ((AssertHelper *)&p2,(Message *)&poveraligned);
                                    }
                                    else {
                                      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start != (pointer)0x0) {
                                        std::
                                        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                      }
                                      poveraligned = (overaligned_type *)(ulong)((uint)p1 & 0x3f);
                                      p2._0_4_ = 0;
                                      testing::internal::CmpHelperEQ<unsigned_long,int>
                                                ((internal *)auStack_48,
                                                 "(((size_t)poveraligned) % kOveralignment)","0",
                                                 (unsigned_long *)&poveraligned,(int *)&p2);
                                      if (auStack_48[0] == (internal)0x0) {
                                        testing::Message::Message((Message *)&poveraligned);
                                        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start == (pointer)0x0) {
                                          pcVar9 = "";
                                        }
                                        else {
                                          pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                        }
                                        testing::internal::AssertHelper::AssertHelper
                                                  ((AssertHelper *)&p2,kFatalFailure,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x602,pcVar9);
                                        testing::internal::AssertHelper::operator=
                                                  ((AssertHelper *)&p2,(Message *)&poveraligned);
                                      }
                                      else {
                                        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start != (pointer)0x0) {
                                          std::
                                          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                        }
                                        VerifyNewHookWasCalled();
                                        operator_delete(p1,0x80,0x40);
                                        VerifyDeleteHookWasCalled();
                                        auStack_48 = (undefined1  [8])operator_new__(0x500,0x40);
                                        (*noopt_helper)(auStack_48);
                                        p1 = (void *)auStack_48;
                                        poveraligned = (overaligned_type *)0x0;
                                        testing::internal::
                                        CmpHelperNE<overaligned_type*,decltype(nullptr)>
                                                  ((internal *)auStack_48,"poveraligned","nullptr",
                                                   (overaligned_type **)&p1,&poveraligned);
                                        if (auStack_48[0] == (internal)0x0) {
                                          testing::Message::Message((Message *)&poveraligned);
                                          if (v.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start ==
                                              (pointer)0x0) {
                                            pcVar9 = "";
                                          }
                                          else {
                                            pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                          }
                                          testing::internal::AssertHelper::AssertHelper
                                                    ((AssertHelper *)&p2,kFatalFailure,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x608,pcVar9);
                                          testing::internal::AssertHelper::operator=
                                                    ((AssertHelper *)&p2,(Message *)&poveraligned);
                                        }
                                        else {
                                          if (v.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_start !=
                                              (pointer)0x0) {
                                            std::
                                            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                            ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                          }
                                          poveraligned = (overaligned_type *)
                                                         (ulong)((uint)p1 & 0x3f);
                                          p2._0_4_ = 0;
                                          testing::internal::CmpHelperEQ<unsigned_long,int>
                                                    ((internal *)auStack_48,
                                                     "(((size_t)poveraligned) % kOveralignment)","0"
                                                     ,(unsigned_long *)&poveraligned,(int *)&p2);
                                          if (auStack_48[0] == (internal)0x0) {
                                            testing::Message::Message((Message *)&poveraligned);
                                            if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start ==
                                                (pointer)0x0) {
                                              pcVar9 = "";
                                            }
                                            else {
                                              pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x609,pcVar9);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&poveraligned)
                                            ;
                                          }
                                          else {
                                            if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              std::
                                              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                            }
                                            VerifyNewHookWasCalled();
                                            operator_delete__(p1,0x500,0x40);
                                            VerifyDeleteHookWasCalled();
                                            auStack_48 = (undefined1  [8])
                                                         strdup("in memory of James Golick");
                                            (*noopt_helper)(auStack_48);
                                            local_60._M_head_impl =
                                                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)auStack_48;
                                            poveraligned = (overaligned_type *)0x0;
                                            testing::internal::CmpHelperNE<char*,decltype(nullptr)>
                                                      ((internal *)auStack_48,"p2","nullptr",
                                                       (char **)&local_60,&poveraligned);
                                            if (auStack_48[0] != (internal)0x0) {
                                              if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start !=
                                                  (pointer)0x0) {
                                                std::
                                                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                              }
                                              VerifyNewHookWasCalled();
                                              _Var8._M_head_impl = local_60._M_head_impl;
                                              free(local_60._M_head_impl);
                                              VerifyDeleteHookWasCalled();
                                              tcmalloc::
                                              Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
                                              ::~Cleanup((
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                                                  *)_Var8._M_head_impl);
                                              puts("Testing large allocation");
                                              local_60._M_head_impl =
                                                   (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)AllocatorState::alloc(&local_a8,0x6400000);
                                              actual_p1_size = 0;
                                              testing::internal::
                                              CmpHelperNE<void*,decltype(nullptr)>
                                                        ((internal *)auStack_48,"p","nullptr",
                                                         &local_60._M_head_impl,
                                                         (void **)&actual_p1_size);
                                              if (auStack_48[0] != (internal)0x0) {
                                                if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start !=
                                                    (pointer)0x0) {
                                                  std::
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  ::operator()((
                                                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                  *)&v,(
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)v.super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start);
                                                }
                                                free(local_60._M_head_impl);
                                                puts("Testing calloc");
                                                TestCalloc(0,0,true);
                                                TestCalloc(0,1,true);
                                                TestCalloc(1,1,true);
                                                TestCalloc(0x400,0,true);
                                                TestCalloc(0x100000,0,true);
                                                TestCalloc(0,0x400,true);
                                                TestCalloc(0,0x100000,true);
                                                TestCalloc(0x100000,2,true);
                                                TestCalloc(2,0x100000,true);
                                                TestCalloc(1000,1000,true);
                                                TestCalloc(0xffffffffffffffff,2,false);
                                                TestCalloc(2,0xffffffffffffffff,false);
                                                TestCalloc(0xffffffffffffffff,0xffffffffffffffff,
                                                           false);
                                                TestCalloc(0x7fffffffffffffff,3,false);
                                                TestCalloc(3,0x7fffffffffffffff,false);
                                                TestCalloc(0x7fffffffffffffff,0x7fffffffffffffff,
                                                           false);
                                                puts("Testing huge allocations");
                                                TestHugeAllocations(&local_a8);
                                                pTVar7 = tcmalloc::TestingPortal::Get();
                                                cVar3 = (**(code **)(*(long *)pTVar7 + 8))(pTVar7);
                                                if (cVar3 == '\0') {
                                                  local_60._M_head_impl =
                                                       (
                                                  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x1494e3;
                                                  puts("Testing out of memory");
                                                  anon_unknown.dwarf_1e1b5::NumericProperty::
                                                  Override((NumericProperty *)auStack_48,
                                                           (size_t)&local_60);
                                                  size = 0;
                                                  while( true ) {
                                                    __ptr = AllocatorState::alloc(&local_a8,size);
                                                    if (__ptr == (void *)0x0) break;
                                                    free(__ptr);
                                                    size = size + 0xa00000;
                                                  }
                                                  tcmalloc::
                                                  Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:151:30)>
                                                  ::~Cleanup((
                                                  Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:151:30)>
                                                  *)auStack_48);
                                                }
                                                goto LAB_001111e5;
                                              }
                                              testing::Message::Message((Message *)&actual_p1_size);
                                              if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start ==
                                                  (pointer)0x0) {
                                                pcVar9 = "";
                                              }
                                              else {
                                                pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                              }
                                              testing::internal::AssertHelper::AssertHelper
                                                        ((AssertHelper *)&local_78,kFatalFailure,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x621,pcVar9);
                                              testing::internal::AssertHelper::operator=
                                                        ((AssertHelper *)&local_78,
                                                         (Message *)&actual_p1_size);
                                              goto LAB_001110f8;
                                            }
                                            testing::Message::Message((Message *)&poveraligned);
                                            if (v.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start ==
                                                (pointer)0x0) {
                                              pcVar9 = "";
                                            }
                                            else {
                                              pcVar9 = *(char **)v.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start;
                                            }
                                            testing::internal::AssertHelper::AssertHelper
                                                      ((AssertHelper *)&p2,kFatalFailure,
                                                                                                              
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                                                  ,0x615,pcVar9);
                                            testing::internal::AssertHelper::operator=
                                                      ((AssertHelper *)&p2,(Message *)&poveraligned)
                                            ;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p2);
            _Var8._M_head_impl =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 poveraligned;
          }
        }
        if (_Var8._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)_Var8._M_head_impl + 8))();
        }
        if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            != (pointer)0x0) {
          _Var8._M_head_impl =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&v;
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)_Var8._M_head_impl,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
        }
        tcmalloc::
        Cleanup<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc:1356:30)>
        ::~Cleanup((Cleanup<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_alk[P]gperftools_src_tests_tcmalloc_unittest_cc:1356:30)>
                    *)_Var8._M_head_impl);
        goto LAB_001111e5;
      }
      testing::Message::Message((Message *)&local_78);
      if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          == (pointer)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = *(char **)v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&p1,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
                 ,0x523,pcVar9);
      testing::internal::AssertHelper::operator=((AssertHelper *)&p1,(Message *)&local_78);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&p1);
    _Var8._M_head_impl = local_78._M_head_impl;
  }
  if (_Var8._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)_Var8._M_head_impl + 8))();
  }
  if (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&v,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       v.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start);
  }
LAB_001111e5:
  std::vector<TestHarness::Type,_std::allocator<TestHarness::Type>_>::~vector
            (&local_a8.super_TestHarness.types_);
  return;
}

Assistant:

TEST(TCMallocTest, AllTests) {
  AllocatorState rnd(100);

  // Check that empty allocation works
  printf("Testing empty allocation\n");
  {
    void* p1 = rnd.alloc(0);
    ASSERT_NE(p1, nullptr);
    void* p2 = rnd.alloc(0);
    ASSERT_NE(p2, nullptr);
    ASSERT_NE(p1, p2);
    free(p1);
    free(p2);
  }

  // This code stresses some of the memory allocation via STL.
  // It may call operator delete(void*, nothrow_t).
  printf("Testing STL use\n");
  {
    std::vector<int> v;
    v.push_back(1);
    v.push_back(2);
    v.push_back(3);
    v.push_back(0);
    std::stable_sort(v.begin(), v.end());
  }

#ifdef ENABLE_SIZED_DELETE
  {
    printf("Testing large sized delete is not crashing\n");
    // Large sized delete
    // case. https://github.com/gperftools/gperftools/issues/1254
    std::vector<char*> addresses;
    constexpr int kSizedDepth = 1024;
    addresses.reserve(kSizedDepth);
    for (int i = 0; i < kSizedDepth; i++) {
      addresses.push_back(noopt(new char[12686]));
    }
    for (int i = 0; i < kSizedDepth; i++) {
      ::operator delete[](addresses[i], 12686);
    }
  }
#endif

  // Test each of the memory-allocation functions once, just as a sanity-check
  printf("Sanity-testing all the memory allocation functions\n");
  {
    // We use new-hook and delete-hook to verify we actually called the
    // tcmalloc version of these routines, and not the libc version.
    SetNewHook();      // defined as part of MAKE_HOOK_CALLBACK, above
    SetDeleteHook();   // ditto
    tcmalloc::Cleanup unhook([] () {
      // Reset the hooks to what they used to be.  These are all
      // defined as part of MAKE_HOOK_CALLBACK, above.
      ResetNewHook();
      ResetDeleteHook();
    });

    void* p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);    // force use of this variable
    VerifyNewHookWasCalled();
    // Also test the non-standard tc_malloc_size
    size_t actual_p1_size = tc_malloc_size(p1);
    ASSERT_GE(actual_p1_size, 10);
    ASSERT_LT(actual_p1_size, 100000);   // a reasonable upper-bound, I think
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(malloc)(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_sized(p1, 10);
    VerifyDeleteHookWasCalled();

    // sadly windows stuff lacks aligned_alloc
    // (https://learn.microsoft.com/en-us/cpp/standard-library/cstdlib?view=msvc-170#remarks-6)
    p1 = noopt(tc_memalign)(1, 10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    tc_free_aligned_sized(p1, 1, 10);
    VerifyDeleteHookWasCalled();

    p1 = tc_malloc_skip_new_handler(10);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(calloc)(10, 2);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    // We make sure we realloc to a big size, since some systems (OS
    // X) will notice if the realloced size continues to fit into the
    // malloc-block and make this a noop if so.
    p1 = noopt(realloc)(p1, 30000);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    VerifyDeleteHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    if (kOSSupportsMemalign) {
      ASSERT_EQ(noopt(PosixMemalign)(&p1, sizeof(p1), 40), 0);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();

      p1 = noopt(Memalign)(sizeof(p1) * 2, 50);
      ASSERT_NE(p1, nullptr);
      VerifyNewHookWasCalled();
      free(p1);
      VerifyDeleteHookWasCalled();
    }

    // Windows has _aligned_malloc.  Let's test that that's captured too.
#if (defined(_MSC_VER) || defined(__MINGW32__)) && !defined(PERFTOOLS_NO_ALIGNED_MALLOC)
    p1 = noopt(_aligned_malloc)(sizeof(p1) * 2, 64);
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    _aligned_free(p1);
    VerifyDeleteHookWasCalled();
#endif

    p1 = noopt(valloc(60));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    p1 = noopt(pvalloc(70));
    ASSERT_NE(p1, nullptr);
    VerifyNewHookWasCalled();
    free(p1);
    VerifyDeleteHookWasCalled();

    char* p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete p2;
    VerifyDeleteHookWasCalled();

    p2 = noopt(new (std::nothrow) char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    delete[] p2;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2);
    VerifyDeleteHookWasCalled();

    // Try to call nothrow's delete too.  Compilers use this.
    p2 = noopt(static_cast<char*>(::operator new(100, std::nothrow)));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::nothrow);
    VerifyDeleteHookWasCalled();

#ifdef ENABLE_SIZED_DELETE
    p2 = noopt(new char);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete(p2, sizeof(char));
    VerifyDeleteHookWasCalled();

    p2 = noopt(new char[100]);
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    ::operator delete[](p2, sizeof(char) * 100);
    VerifyDeleteHookWasCalled();
#endif

    overaligned_type* poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete poveraligned;
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new(std::nothrow) overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    delete[] poveraligned;
    VerifyDeleteHookWasCalled();

    // Another way of calling operator new
    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment))));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    p2 = noopt(static_cast<char*>(::operator new(100, std::align_val_t(kOveralignment), std::nothrow)));
    ASSERT_NE(p2, nullptr);
    ASSERT_EQ((((size_t)p2) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(p2, std::align_val_t(kOveralignment), std::nothrow);
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete(poveraligned, sizeof(overaligned_type), std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

    poveraligned = noopt(new overaligned_type[10]);
    ASSERT_NE(poveraligned, nullptr);
    ASSERT_EQ((((size_t)poveraligned) % kOveralignment), 0);
    VerifyNewHookWasCalled();
    ::operator delete[](poveraligned, sizeof(overaligned_type) * 10, std::align_val_t(kOveralignment));
    VerifyDeleteHookWasCalled();

// On AIX user defined malloc replacement of libc routines
// cannot be done at link time must be done a runtime via
// environment variable MALLOCTYPE
#if !defined(_AIX)
    // Try strdup(), which the system allocates but we must free.  If
    // all goes well, libc will use our malloc!
    p2 = noopt(strdup("in memory of James Golick"));
    ASSERT_NE(p2, nullptr);
    VerifyNewHookWasCalled();
    free(p2);
    VerifyDeleteHookWasCalled();
#endif
  }

  // Check that "lots" of memory can be allocated
  printf("Testing large allocation\n");
  {
    const int mb_to_allocate = 100;
    void* p = rnd.alloc(mb_to_allocate << 20);
    ASSERT_NE(p, nullptr);  // could not allocate
    free(p);
  }

  // Check calloc() with various arguments
  printf("Testing calloc\n");
  TestCalloc(0, 0, true);
  TestCalloc(0, 1, true);
  TestCalloc(1, 1, true);
  TestCalloc(1<<10, 0, true);
  TestCalloc(1<<20, 0, true);
  TestCalloc(0, 1<<10, true);
  TestCalloc(0, 1<<20, true);
  TestCalloc(1<<20, 2, true);
  TestCalloc(2, 1<<20, true);
  TestCalloc(1000, 1000, true);

  TestCalloc(kMaxSize, 2, false);
  TestCalloc(2, kMaxSize, false);
  TestCalloc(kMaxSize, kMaxSize, false);

  TestCalloc(kMaxSignedSize, 3, false);
  TestCalloc(3, kMaxSignedSize, false);
  TestCalloc(kMaxSignedSize, kMaxSignedSize, false);

  // Do the memory intensive tests after threads are done, since exhausting
  // the available address space can make pthread_create to fail.

  // Check that huge allocations fail with nullptr instead of crashing
  printf("Testing huge allocations\n");
  TestHugeAllocations(&rnd);

  // Check that large allocations fail with nullptr instead of crashing
  //
  // debug allocation takes forever for huge allocs
  if (!TestingPortal::Get()->IsDebuggingMalloc()) {
    constexpr NumericProperty kHeapLimitMB{"tcmalloc.heap_limit_mb"};
    printf("Testing out of memory\n");
    tcmalloc::Cleanup cleanup_limit = kHeapLimitMB.Override(1<<10); // 1 gig. Note, this is in megs.
    // Don't exercise more than 1 gig, no need to.
    for (int s = 0; ; s += (10<<20)) {
      void* large_object = rnd.alloc(s);
      if (large_object == nullptr) {
        break;
      }
      free(large_object);
    }
  }
}